

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void av1_set_offsets(AV1_COMP *cpi,TileInfo *tile,MACROBLOCK *x,int mi_row,int mi_col,
                    BLOCK_SIZE bsize)

{
  int iVar1;
  MB_MODE_INFO *pMVar2;
  ushort uVar3;
  EncSegmentationInfo *pEVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  
  av1_set_offsets_without_segment_id(cpi,tile,x,mi_row,mi_col,bsize);
  pMVar2 = *(x->e_mbd).mi;
  uVar3 = *(ushort *)&pMVar2->field_0xa7 & 0xfff8;
  *(ushort *)&pMVar2->field_0xa7 = uVar3;
  if ((cpi->common).seg.enabled != '\0') {
    if (cpi->vaq_refresh == 0) {
      pEVar4 = &cpi->enc_seg;
      if ((cpi->common).seg.update_map == '\0') {
        pEVar4 = (EncSegmentationInfo *)&(cpi->common).last_frame_seg_map;
      }
      if (pEVar4->map == (uint8_t *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar7 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [bsize] <= (int)uVar7) {
          uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [bsize];
        }
        uVar6 = 0;
        if (0 < (int)uVar7) {
          iVar1 = (cpi->common).mi_params.mi_cols;
          uVar8 = (ulong)(uint)(iVar1 - mi_col);
          if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [bsize] <= iVar1 - mi_col) {
            uVar8 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [bsize];
          }
          iVar5 = mi_row * iVar1 + mi_col;
          bVar9 = 8;
          bVar10 = 0;
          do {
            uVar12 = uVar8;
            iVar11 = iVar5;
            if (0 < (int)uVar8) {
              do {
                bVar10 = pEVar4->map[iVar11];
                if (bVar9 < bVar10) {
                  bVar10 = bVar9;
                }
                iVar11 = iVar11 + 1;
                uVar12 = uVar12 - 1;
                bVar9 = bVar10;
              } while (uVar12 != 0);
            }
            uVar6 = uVar6 + 1;
            iVar5 = iVar5 + iVar1;
          } while (uVar6 != uVar7);
          uVar6 = (uint)(bVar10 & 7);
        }
      }
      *(ushort *)&pMVar2->field_0xa7 = (ushort)uVar6 | uVar3;
    }
    av1_init_plane_quantizers(cpi,x,*(ushort *)&pMVar2->field_0xa7 & 7,0);
    return;
  }
  return;
}

Assistant:

void av1_set_offsets(const AV1_COMP *const cpi, const TileInfo *const tile,
                     MACROBLOCK *const x, int mi_row, int mi_col,
                     BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const struct segmentation *const seg = &cm->seg;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi;

  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);

  // Setup segment ID.
  mbmi = xd->mi[0];
  mbmi->segment_id = 0;
  if (seg->enabled) {
    if (seg->enabled && !cpi->vaq_refresh) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      mbmi->segment_id =
          map ? get_segment_id(&cm->mi_params, map, bsize, mi_row, mi_col) : 0;
    }
    av1_init_plane_quantizers(cpi, x, mbmi->segment_id, 0);
  }
#ifndef NDEBUG
  x->last_set_offsets_loc.mi_row = mi_row;
  x->last_set_offsets_loc.mi_col = mi_col;
  x->last_set_offsets_loc.bsize = bsize;
#endif  // NDEBUG
}